

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O0

Node * __thiscall wabt::AST::InsertNode(AST *this,NodeType ntype,ExprType etype,Expr *e,Index nargs)

{
  size_type sVar1;
  reference pvVar2;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_a8;
  const_iterator local_a0;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_98;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_90;
  const_iterator local_88;
  vector<wabt::Node,_std::allocator<wabt::Node>_> *local_80;
  vector<wabt::Node,_std::allocator<wabt::Node>_> *local_78;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_70;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_68;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_60;
  undefined1 local_58 [8];
  Node n;
  Index nargs_local;
  Expr *e_local;
  ExprType etype_local;
  NodeType ntype_local;
  AST *this_local;
  
  n.u.field_0.var_count = nargs;
  sVar1 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::size(&this->exp_stack);
  if (n.u.field_0.var_count <= sVar1) {
    Node::Node((Node *)local_58,ntype,etype,e,(Var *)0x0);
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::reserve
              ((vector<wabt::Node,_std::allocator<wabt::Node>_> *)&n.e,(ulong)n.u.field_0.var_count)
    ;
    local_68._M_current =
         (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&this->exp_stack);
    local_60 = __gnu_cxx::
               __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
               ::operator-(&local_68,(ulong)n.u.field_0.var_count);
    local_70._M_current =
         (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&this->exp_stack);
    local_78 = (vector<wabt::Node,_std::allocator<wabt::Node>_> *)
               std::back_inserter<std::vector<wabt::Node,std::allocator<wabt::Node>>>
                         ((vector<wabt::Node,_std::allocator<wabt::Node>_> *)&n.e);
    local_80 = (vector<wabt::Node,_std::allocator<wabt::Node>_> *)
               std::
               move<__gnu_cxx::__normal_iterator<wabt::Node*,std::vector<wabt::Node,std::allocator<wabt::Node>>>,std::back_insert_iterator<std::vector<wabt::Node,std::allocator<wabt::Node>>>>
                         (local_60,local_70,
                          (back_insert_iterator<std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                           )local_78);
    local_98._M_current =
         (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&this->exp_stack);
    local_90 = __gnu_cxx::
               __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
               ::operator-(&local_98,(ulong)n.u.field_0.var_count);
    __gnu_cxx::
    __normal_iterator<wabt::Node_const*,std::vector<wabt::Node,std::allocator<wabt::Node>>>::
    __normal_iterator<wabt::Node*>
              ((__normal_iterator<wabt::Node_const*,std::vector<wabt::Node,std::allocator<wabt::Node>>>
                *)&local_88,&local_90);
    local_a8._M_current =
         (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&this->exp_stack);
    __gnu_cxx::
    __normal_iterator<wabt::Node_const*,std::vector<wabt::Node,std::allocator<wabt::Node>>>::
    __normal_iterator<wabt::Node*>
              ((__normal_iterator<wabt::Node_const*,std::vector<wabt::Node,std::allocator<wabt::Node>>>
                *)&local_a0,&local_a8);
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::erase(&this->exp_stack,local_88,local_a0);
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::push_back
              (&this->exp_stack,(value_type *)local_58);
    pvVar2 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::back(&this->exp_stack);
    Node::~Node((Node *)local_58);
    return pvVar2;
  }
  __assert_fail("exp_stack.size() >= nargs",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/decompiler-ast.h"
                ,0x62,"Node &wabt::AST::InsertNode(NodeType, ExprType, const Expr *, Index)");
}

Assistant:

Node& InsertNode(NodeType ntype, ExprType etype, const Expr* e, Index nargs) {
    assert(exp_stack.size() >= nargs);
    Node n{ntype, etype, e, nullptr};
    n.children.reserve(nargs);
    std::move(exp_stack.end() - nargs, exp_stack.end(),
              std::back_inserter(n.children));
    exp_stack.erase(exp_stack.end() - nargs, exp_stack.end());
    exp_stack.push_back(std::move(n));
    return exp_stack.back();
  }